

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_commodities.cpp
# Opt level: O0

void __thiscall
commodities_unusualFromString_Test::TestBody(commodities_unusualFromString_Test *this)

{
  bool bVar1;
  uint64_t match_flags;
  char *pcVar2;
  char *in_R9;
  precise_unit pVar3;
  string local_c8;
  AssertHelper local_a8;
  Message local_a0;
  unit_data local_98;
  bool local_91;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_;
  Message local_78;
  uint local_70;
  uint32_t local_6c;
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  allocator local_41;
  string local_40;
  undefined1 local_20 [8];
  precise_unit punit;
  commodities_unusualFromString_Test *this_local;
  
  punit._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"{happy\'u}",&local_41);
  match_flags = units::getDefaultFlags();
  pVar3 = units::unit_from_string(&local_40,match_flags);
  punit.multiplier_ = pVar3._8_8_;
  local_20 = (undefined1  [8])pVar3.multiplier_;
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_6c = units::precise_unit::commodity((precise_unit *)local_20);
  local_70 = 0;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_68,"punit.commodity()","0U",&local_6c,&local_70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_commodities.cpp"
               ,0xb7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  local_98 = units::precise_unit::base_units((precise_unit *)local_20);
  local_91 = units::precise::custom::is_custom_unit(&local_98);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_90,&local_91,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c8,(internal *)local_90,
               (AssertionResult *)"precise::custom::is_custom_unit(punit.base_units())","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_commodities.cpp"
               ,0xb8,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  return;
}

Assistant:

TEST(commodities, unusualFromString)
{
    auto punit = unit_from_string("{happy'u}");
    EXPECT_EQ(punit.commodity(), 0U);
    EXPECT_TRUE(precise::custom::is_custom_unit(punit.base_units()));
}